

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5ExprSynonymList(Fts5ExprTerm *pTerm,i64 iRowid,Fts5Buffer *pBuf,u8 **pa,int *pn)

{
  Fts5IndexIter *pFVar1;
  u8 *a;
  int iVar2;
  undefined8 *__dest;
  uint uVar3;
  undefined8 *puVar4;
  long iPos;
  long lVar5;
  ulong uVar6;
  undefined8 *puVar7;
  i64 *piOff;
  long in_FS_OFFSET;
  Fts5PoslistWriter writer;
  Fts5PoslistReader aStatic [4];
  int local_f4;
  uint local_f0;
  Fts5PoslistWriter local_c0;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = 0xaaaaaaaa;
  uStack_44 = 0xaaaaaaaa;
  uStack_40 = 0xaaaaaaaa;
  uStack_3c = 0xaaaaaaaa;
  local_58 = 0xaaaaaaaa;
  uStack_54 = 0xaaaaaaaa;
  uStack_50 = 0xaaaaaaaa;
  uStack_4c = 0xaaaaaaaa;
  local_68 = 0xaaaaaaaa;
  uStack_64 = 0xaaaaaaaa;
  uStack_60 = 0xaaaaaaaa;
  uStack_5c = 0xaaaaaaaa;
  local_78 = 0xaaaaaaaa;
  uStack_74 = 0xaaaaaaaa;
  uStack_70 = 0xaaaaaaaa;
  uStack_6c = 0xaaaaaaaa;
  local_88 = 0xaaaaaaaa;
  uStack_84 = 0xaaaaaaaa;
  uStack_80 = 0xaaaaaaaa;
  uStack_7c = 0xaaaaaaaa;
  local_98 = 0xaaaaaaaa;
  uStack_94 = 0xaaaaaaaa;
  uStack_90 = 0xaaaaaaaa;
  uStack_8c = 0xaaaaaaaa;
  local_a8 = 0xaaaaaaaa;
  uStack_a4 = 0xaaaaaaaa;
  uStack_a0 = 0xaaaaaaaa;
  uStack_9c = 0xaaaaaaaa;
  local_b8 = 0xaaaaaaaa;
  uStack_b4 = 0xaaaaaaaa;
  uStack_b0 = 0xaaaaaaaa;
  uStack_ac = 0xaaaaaaaa;
  if (pTerm == (Fts5ExprTerm *)0x0) {
    puVar4 = (undefined8 *)&local_b8;
    local_f4 = 0;
    uVar3 = 0;
  }
  else {
    local_f0 = 4;
    uVar3 = 0;
    local_f4 = 0;
    puVar7 = (undefined8 *)&local_b8;
    do {
      pFVar1 = pTerm->pIter;
      puVar4 = puVar7;
      if ((pFVar1->bEof == '\0') && (pFVar1->iRowid == iRowid)) {
        if (pFVar1->nData == 0) {
          iVar2 = 4;
        }
        else {
          lVar5 = (long)(int)uVar3;
          if (uVar3 == local_f0) {
            iVar2 = sqlite3_initialize();
            if (iVar2 == 0) {
              __dest = (undefined8 *)sqlite3Malloc((long)(int)local_f0 << 6);
            }
            else {
              __dest = (undefined8 *)0x0;
            }
            if (__dest == (undefined8 *)0x0) {
              iVar2 = 5;
              local_f4 = 7;
            }
            else {
              memcpy(__dest,puVar7,lVar5 << 5);
              local_f0 = local_f0 * 2;
              iVar2 = 0;
              puVar4 = __dest;
              if (puVar7 != (undefined8 *)&local_b8) {
                sqlite3_free(puVar7);
              }
            }
            if (__dest == (undefined8 *)0x0) goto LAB_001e3f5a;
          }
          a = pFVar1->pData;
          iVar2 = pFVar1->nData;
          puVar7 = puVar4 + lVar5 * 4;
          *puVar7 = 0;
          puVar7[1] = 0;
          puVar7[2] = 0;
          puVar7[3] = 0;
          *puVar7 = a;
          *(int *)(puVar7 + 1) = iVar2;
          iVar2 = sqlite3Fts5PoslistNext64
                            (a,iVar2,(int *)((long)puVar7 + 0xc),puVar4 + lVar5 * 4 + 3);
          if (iVar2 != 0) {
            *(undefined1 *)((long)puVar4 + lVar5 * 0x20 + 0x11) = 1;
          }
          uVar3 = uVar3 + 1;
          iVar2 = 0;
        }
      }
      else {
        iVar2 = 0;
      }
LAB_001e3f5a:
      if ((iVar2 != 0) && (iVar2 != 4)) {
        if (iVar2 == 5) goto LAB_001e4162;
        goto LAB_001e4176;
      }
      pTerm = pTerm->pSynonym;
      puVar7 = puVar4;
    } while (pTerm != (Fts5ExprTerm *)0x0);
  }
  if (uVar3 != 1) {
    local_c0.iPrev = 0;
    pBuf->n = 0;
    lVar5 = -1;
    do {
      iPos = 0x7fffffffffffffff;
      if (0 < (int)uVar3) {
        iPos = 0x7fffffffffffffff;
        uVar6 = (ulong)uVar3;
        piOff = puVar4 + 3;
        do {
          if (*(char *)((long)piOff + -7) == '\0') {
            if (*piOff == lVar5) {
              iVar2 = sqlite3Fts5PoslistNext64
                                ((u8 *)piOff[-3],(int)piOff[-2],(int *)((long)piOff + -0xc),piOff);
              if (iVar2 != 0) {
                *(undefined1 *)((long)piOff + -7) = 1;
              }
              if (*(char *)((long)piOff + -7) != '\0') goto LAB_001e40f1;
            }
            if (*piOff < iPos) {
              iPos = *piOff;
            }
          }
LAB_001e40f1:
          piOff = piOff + 4;
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
      }
      if (local_f4 != 0 || iPos == 0x7fffffffffffffff) goto code_r0x001e4134;
      local_f4 = sqlite3Fts5PoslistWriterAppend(pBuf,&local_c0,iPos);
      lVar5 = iPos;
    } while( true );
  }
  *pa = (u8 *)*puVar4;
  *pn = *(int *)(puVar4 + 1);
LAB_001e4162:
  if (puVar4 != (undefined8 *)&local_b8) {
    sqlite3_free(puVar4);
  }
LAB_001e4176:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return local_f4;
  }
  __stack_chk_fail();
code_r0x001e4134:
  if (local_f4 == 0) {
    *pa = pBuf->p;
    *pn = pBuf->n;
  }
  goto LAB_001e4162;
}

Assistant:

static int fts5ExprSynonymList(
  Fts5ExprTerm *pTerm,
  i64 iRowid,
  Fts5Buffer *pBuf,               /* Use this buffer for space if required */
  u8 **pa, int *pn
){
  Fts5PoslistReader aStatic[4];
  Fts5PoslistReader *aIter = aStatic;
  int nIter = 0;
  int nAlloc = 4;
  int rc = SQLITE_OK;
  Fts5ExprTerm *p;

  assert( pTerm->pSynonym );
  for(p=pTerm; p; p=p->pSynonym){
    Fts5IndexIter *pIter = p->pIter;
    if( sqlite3Fts5IterEof(pIter)==0 && pIter->iRowid==iRowid ){
      if( pIter->nData==0 ) continue;
      if( nIter==nAlloc ){
        sqlite3_int64 nByte = sizeof(Fts5PoslistReader) * nAlloc * 2;
        Fts5PoslistReader *aNew = (Fts5PoslistReader*)sqlite3_malloc64(nByte);
        if( aNew==0 ){
          rc = SQLITE_NOMEM;
          goto synonym_poslist_out;
        }
        memcpy(aNew, aIter, sizeof(Fts5PoslistReader) * nIter);
        nAlloc = nAlloc*2;
        if( aIter!=aStatic ) sqlite3_free(aIter);
        aIter = aNew;
      }
      sqlite3Fts5PoslistReaderInit(pIter->pData, pIter->nData, &aIter[nIter]);
      assert( aIter[nIter].bEof==0 );
      nIter++;
    }
  }

  if( nIter==1 ){
    *pa = (u8*)aIter[0].a;
    *pn = aIter[0].n;
  }else{
    Fts5PoslistWriter writer = {0};
    i64 iPrev = -1;
    fts5BufferZero(pBuf);
    while( 1 ){
      int i;
      i64 iMin = FTS5_LARGEST_INT64;
      for(i=0; i<nIter; i++){
        if( aIter[i].bEof==0 ){
          if( aIter[i].iPos==iPrev ){
            if( sqlite3Fts5PoslistReaderNext(&aIter[i]) ) continue;
          }
          if( aIter[i].iPos<iMin ){
            iMin = aIter[i].iPos;
          }
        }
      }
      if( iMin==FTS5_LARGEST_INT64 || rc!=SQLITE_OK ) break;
      rc = sqlite3Fts5PoslistWriterAppend(pBuf, &writer, iMin);
      iPrev = iMin;
    }
    if( rc==SQLITE_OK ){
      *pa = pBuf->p;
      *pn = pBuf->n;
    }
  }

 synonym_poslist_out:
  if( aIter!=aStatic ) sqlite3_free(aIter);
  return rc;
}